

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::RepeatLoopInst::Exec
          (RepeatLoopInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  undefined4 uVar1;
  int iVar2;
  CharCount CVar3;
  Label LVar4;
  Program *pPVar5;
  long lVar6;
  PageAllocation *pPVar7;
  size_t sVar8;
  code *pcVar9;
  bool bVar10;
  uint uVar11;
  undefined4 *puVar12;
  List<unsigned_int,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer> *this_00;
  ulong uVar13;
  int i;
  int iVar14;
  ulong uVar15;
  ArenaAllocator *alloc;
  uint uVar16;
  LoopInfo *pLVar17;
  
  uVar15 = (ulong)(this->super_RepeatLoopMixin).beginLabel;
  if ((ulong)(((matcher->program).ptr)->rep).insts.instsLen < uVar15 + 0x1c) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                        ,0x774,"(label + sizeof(T) <= program->rep.insts.instsLen)",
                        "label + sizeof(T) <= program->rep.insts.instsLen");
    if (!bVar10) goto LAB_00f0b6dc;
    *puVar12 = 0;
  }
  if ((((matcher->program).ptr)->rep).insts.insts.ptr[uVar15] != 'D') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                        ,0x775,"(((Inst*)(program->rep.insts.insts + label))->tag == tag)",
                        "((Inst*)(program->rep.insts.insts + label))->tag == tag");
    if (!bVar10) goto LAB_00f0b6dc;
    *puVar12 = 0;
  }
  pPVar5 = (matcher->program).ptr;
  lVar6 = *(long *)&pPVar5->rep;
  iVar14 = *(int *)(lVar6 + 1 + uVar15);
  if (((long)iVar14 < 0) || (pPVar5->numLoops <= iVar14)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar12 = 1;
    bVar10 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                        ,0x77b,"(loopId >= 0 && loopId < program->numLoops)",
                        "loopId >= 0 && loopId < program->numLoops");
    if (!bVar10) goto LAB_00f0b6dc;
    *puVar12 = 0;
  }
  pLVar17 = (matcher->loopInfos).ptr + iVar14;
  if (*(char *)(lVar6 + 0xe + uVar15) == '\x01') {
    if ((contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
        super_ContinuousPageStack<1UL>.bufferSize -
        (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
        super_ContinuousPageStack<1UL>.nextTop < 0x28) {
      ContinuousPageStack<1UL>::Resize((ContinuousPageStack<1UL> *)contStack,0x28);
    }
    if ((contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
        super_ContinuousPageStack<1UL>.bufferSize == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                          ,199,"(bufferSize)","bufferSize");
      if (!bVar10) goto LAB_00f0b6dc;
      *puVar12 = 0;
    }
    pPVar7 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
             super_ContinuousPageStack<1UL>.pageAllocation;
    sVar8 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
            super_ContinuousPageStack<1UL>.nextTop;
    (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
    super_ContinuousPageStack<1UL>.nextTop = sVar8 + 0x28;
    *(size_t *)((long)&pPVar7[1].pageCount + sVar8) =
         (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
         topElementSize;
    (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).topElementSize
         = 0x28;
    uVar1 = *(undefined4 *)(lVar6 + 1 + uVar15);
    *(undefined1 *)((long)&pPVar7[2].pageCount + sVar8) = 1;
    *(undefined ***)((long)&pPVar7[1].segment + sVar8) = &PTR_Print_01559968;
    *(undefined4 *)((long)&pPVar7[2].pageCount + sVar8 + 4) = uVar1;
    *(CharCount *)((long)&pPVar7[2].segment + sVar8) = pLVar17->number;
    *(CharCount *)((long)&pPVar7[2].segment + sVar8 + 4) = pLVar17->startInputOffset;
    *(undefined8 *)((long)&pPVar7[3].pageCount + sVar8) = 0;
    if (pLVar17->offsetsOfFollowFirst !=
        (List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
        0x0) {
      alloc = &((((((matcher->pattern).ptr)->library).ptr)->super_JavascriptLibraryBase).
                scriptContext.ptr)->regexAllocator;
      this_00 = (List<unsigned_int,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>
                 *)new<Memory::ArenaAllocator>(0x30,alloc,0x366bee);
      *(undefined8 *)(this_00 + 8) = 0;
      *(undefined4 *)(this_00 + 0x10) = 0;
      *(ArenaAllocator **)(this_00 + 0x18) = alloc;
      *(undefined ***)this_00 = &PTR_IsReadOnly_014ea098;
      *(undefined8 *)(this_00 + 0x20) = 0x400000000;
      *(List<unsigned_int,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer> **)
       ((long)&pPVar7[3].pageCount + sVar8) = this_00;
      JsUtil::List<unsigned_int,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>::
      Copy<JsUtil::List<unsigned_int,Memory::ArenaAllocator,false,Js::CopyRemovePolicy,DefaultComparer>>
                (this_00,pLVar17->offsetsOfFollowFirst);
    }
    Matcher::PushStats(matcher,contStack,input);
  }
  uVar11 = pLVar17->number + 1;
  pLVar17->number = uVar11;
  uVar16 = *(uint *)(lVar6 + 5 + uVar15);
  if (uVar11 < uVar16) {
    pLVar17->startInputOffset = *inputOffset;
    if (*(char *)(lVar6 + 0xe + uVar15) == '\x01') {
      iVar14 = *(int *)(lVar6 + 0x17 + uVar15);
      if (-1 < iVar14) {
        Matcher::DoSaveInnerGroups
                  (matcher,*(int *)(lVar6 + 0x13 + uVar15),iVar14,true,input,contStack);
      }
    }
    else {
      iVar14 = *(int *)(lVar6 + 0x13 + uVar15);
      iVar2 = *(int *)(lVar6 + 0x17 + uVar15);
      if (iVar14 <= iVar2) {
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        do {
          if ((iVar14 < 0) || ((int)(uint)((matcher->program).ptr)->numGroups <= iVar14)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar12 = 1;
            bVar10 = Js::Throw::ReportAssert
                               ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                                ,0x782,"(groupId >= 0 && groupId < program->numGroups)",
                                "groupId >= 0 && groupId < program->numGroups");
            if (!bVar10) goto LAB_00f0b6dc;
            *puVar12 = 0;
          }
          (matcher->groupInfos).ptr[iVar14].length = 0xffffffff;
          iVar14 = iVar14 + 1;
        } while (iVar14 <= iVar2);
      }
    }
    uVar16 = (this->super_RepeatLoopMixin).beginLabel + 0x1c;
    if ((((matcher->program).ptr)->rep).insts.instsLen <= uVar16) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                          ,0x76d,"(label < program->rep.insts.instsLen)",
                          "label < program->rep.insts.instsLen");
      if (!bVar10) goto LAB_00f0b6dc;
      *puVar12 = 0;
    }
    *instPointer = (((matcher->program).ptr)->rep).insts.insts.ptr + uVar16;
  }
  else {
    if ((uVar16 < uVar11) && (*inputOffset == pLVar17->startInputOffset)) {
      bVar10 = Matcher::Fail(matcher,input,inputOffset,instPointer,contStack,assertionStack,qcTicks)
      ;
      return bVar10;
    }
    uVar16 = *(uint *)(lVar6 + 9 + uVar15);
    if ((uVar16 != 0xffffffff) && (uVar16 <= uVar11)) {
      uVar16 = *(uint *)(lVar6 + 0xf + uVar15);
      if ((((matcher->program).ptr)->rep).insts.instsLen <= uVar16) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                            ,0x76d,"(label < program->rep.insts.instsLen)",
                            "label < program->rep.insts.instsLen");
        if (!bVar10) goto LAB_00f0b6dc;
        *puVar12 = 0;
      }
      *instPointer = (((matcher->program).ptr)->rep).insts.insts.ptr + uVar16;
      return false;
    }
    uVar13 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
             super_ContinuousPageStack<1UL>.bufferSize -
             (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
             super_ContinuousPageStack<1UL>.nextTop;
    if (*(char *)(lVar6 + 0x1b + uVar15) != '\x01') {
      if (uVar13 < 0x20) {
        ContinuousPageStack<1UL>::Resize((ContinuousPageStack<1UL> *)contStack,0x20);
      }
      if ((contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
          super_ContinuousPageStack<1UL>.bufferSize == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                            ,199,"(bufferSize)","bufferSize");
        if (!bVar10) goto LAB_00f0b6dc;
        *puVar12 = 0;
      }
      pPVar7 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
               super_ContinuousPageStack<1UL>.pageAllocation;
      sVar8 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
              super_ContinuousPageStack<1UL>.nextTop;
      (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
      super_ContinuousPageStack<1UL>.nextTop = sVar8 + 0x20;
      *(size_t *)((long)&pPVar7[1].pageCount + sVar8) =
           (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
           topElementSize;
      (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
      topElementSize = 0x20;
      LVar4 = (this->super_RepeatLoopMixin).beginLabel;
      CVar3 = *inputOffset;
      *(undefined1 *)((long)&pPVar7[2].pageCount + sVar8) = 5;
      *(undefined ***)((long)&pPVar7[1].segment + sVar8) = &PTR_Print_01559848;
      *(Label *)((long)&pPVar7[2].pageCount + sVar8 + 4) = LVar4;
      *(CharCount *)((long)&pPVar7[2].segment + sVar8) = CVar3;
      Matcher::PushStats(matcher,contStack,input);
      uVar16 = *(uint *)(lVar6 + 0xf + uVar15);
      if ((((matcher->program).ptr)->rep).insts.instsLen <= uVar16) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                            ,0x76d,"(label < program->rep.insts.instsLen)",
                            "label < program->rep.insts.instsLen");
        if (!bVar10) goto LAB_00f0b6dc;
        *puVar12 = 0;
      }
      *instPointer = (((matcher->program).ptr)->rep).insts.insts.ptr + uVar16;
      return false;
    }
    if (uVar13 < 0x20) {
      ContinuousPageStack<1UL>::Resize((ContinuousPageStack<1UL> *)contStack,0x20);
    }
    if ((contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
        super_ContinuousPageStack<1UL>.bufferSize == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                          ,199,"(bufferSize)","bufferSize");
      if (!bVar10) goto LAB_00f0b6dc;
      *puVar12 = 0;
    }
    pPVar7 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
             super_ContinuousPageStack<1UL>.pageAllocation;
    sVar8 = (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
            super_ContinuousPageStack<1UL>.nextTop;
    (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
    super_ContinuousPageStack<1UL>.nextTop = sVar8 + 0x20;
    *(size_t *)((long)&pPVar7[1].pageCount + sVar8) =
         (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).
         topElementSize;
    (contStack->super_ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>).topElementSize
         = 0x20;
    CVar3 = *inputOffset;
    uVar1 = *(undefined4 *)(lVar6 + 0xf + uVar15);
    *(undefined1 *)((long)&pPVar7[2].pageCount + sVar8) = 0;
    *(undefined ***)((long)&pPVar7[1].segment + sVar8) = &PTR_Print_01559788;
    *(CharCount *)((long)&pPVar7[2].pageCount + sVar8 + 4) = CVar3;
    *(undefined4 *)((long)&pPVar7[2].segment + sVar8) = uVar1;
    Matcher::PushStats(matcher,contStack,input);
    pLVar17->startInputOffset = *inputOffset;
    iVar14 = *(int *)(lVar6 + 0x17 + uVar15);
    if (-1 < iVar14) {
      Matcher::DoSaveInnerGroups
                (matcher,*(int *)(lVar6 + 0x13 + uVar15),iVar14,true,input,contStack);
    }
    uVar16 = (this->super_RepeatLoopMixin).beginLabel + 0x1c;
    if ((((matcher->program).ptr)->rep).insts.instsLen <= uVar16) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.h"
                          ,0x76d,"(label < program->rep.insts.instsLen)",
                          "label < program->rep.insts.instsLen");
      if (!bVar10) {
LAB_00f0b6dc:
        pcVar9 = (code *)invalidInstructionException();
        (*pcVar9)();
      }
      *puVar12 = 0;
    }
    *instPointer = (((matcher->program).ptr)->rep).insts.insts.ptr + uVar16;
  }
  return false;
}

Assistant:

inline bool RepeatLoopInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        BeginLoopInst* begin = matcher.L2I(BeginLoop, beginLabel);
        LoopInfo* loopInfo = matcher.LoopIdToLoopInfo(begin->loopId);

        // See comment (****) above.
        if (begin->hasInnerNondet)
        {
            PUSH(contStack, RestoreLoopCont, begin->loopId, *loopInfo, matcher);
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
        }

        loopInfo->number++;

        if (loopInfo->number < begin->repeats.lower)
        {
            // Must match another iteration of body.
            loopInfo->startInputOffset = inputOffset;
            if(begin->hasInnerNondet)
            {
                // If it backtracks into the loop body of an earlier iteration, it must restore inner groups for that iteration.
                // Save the inner groups and reset them for the next iteration.
                matcher.SaveInnerGroups(begin->minBodyGroupId, begin->maxBodyGroupId, true, input, contStack);
            }
            else
            {
                // If it backtracks, the entire loop will fail, so no need to restore groups. Just reset the inner groups for
                // the next iteration.
                matcher.ResetInnerGroups(begin->minBodyGroupId, begin->maxBodyGroupId);
            }
            instPointer = matcher.LabelToInstPointer(beginLabel + sizeof(BeginLoopInst));
        }
        else if (inputOffset == loopInfo->startInputOffset && loopInfo->number > begin->repeats.lower)
        {
            // The minimum number of iterations has been satisfied but the last iteration made no progress.
            //   - With greedy & deterministic body, FAIL so as to undo that iteration and restore group bindings.
            //   - With greedy & non-deterministic body, FAIL so as to try another body alternative
            //   - With non-greedy, we're trying an additional iteration because the follow failed. But
            //     since we didn't consume anything the follow will fail again, so fail
            //
            return matcher.Fail(FAIL_PARAMETERS);
        }
        else if (begin->repeats.upper != CharCountFlag && loopInfo->number >= (CharCount)begin->repeats.upper)
        {
            // Success: proceed to remainder.
            instPointer = matcher.LabelToInstPointer(begin->exitLabel);
        }
        else if (begin->isGreedy)
        {
            // CHOICEPOINT: Try one more iteration of body, if backtrack continue from here with no more iterations
            PUSH(contStack, ResumeCont, inputOffset, begin->exitLabel);
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
            loopInfo->startInputOffset = inputOffset;

            // If backtrack, we must continue with previous group bindings
            matcher.SaveInnerGroups(begin->minBodyGroupId, begin->maxBodyGroupId, true, input, contStack);
            instPointer = matcher.LabelToInstPointer(beginLabel + sizeof(BeginLoopInst));
        }
        else
        {
            // CHOICEPOINT: Try no more iterations of body, if backtrack do one more iteration of body from here
            PUSH(contStack, RepeatLoopCont, beginLabel, inputOffset);
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.PushStats(contStack, input);
#endif
            instPointer = matcher.LabelToInstPointer(begin->exitLabel);
        }
        return false;
    }